

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldEncodingSynapse.cpp
# Opt level: O0

void __thiscall
ReceptiveFieldEncodingSynapse::initialize
          (ReceptiveFieldEncodingSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  ostream *this_00;
  undefined8 *puVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  double dVar5;
  int i;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff98;
  value_type *__x;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffffa0;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffffb0;
  Scalar *in_stack_ffffffffffffffb8;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  ReceptiveFieldEncodingSynapse *this_02;
  
  iVar1 = (**(code **)(*in_RSI + 8))();
  in_RDI[0xc] = iVar1;
  iVar1 = (**(code **)(*in_RDX + 8))();
  in_RDI[0xd] = iVar1;
  if (in_RDI[0xc] != 1) {
    this_00 = std::operator<<((ostream *)&std::cout,"There can only be one input neuron");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "There can only be one input neuron";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  *(long **)(in_RDI + 2) = in_RSI;
  *(long **)(in_RDI + 4) = in_RDX;
  pCVar3 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x12) = pCVar3;
  pLVar4 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x14) = pLVar4;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(in_stack_ffffffffffffffb0,in_RDI);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x11c53e);
  this_02 = (ReceptiveFieldEncodingSynapse *)0xbff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 0xe) = **(undefined8 **)(in_RDI + 6);
  dVar5 = gaussian(this_02,in_stack_ffffffffffffffcc,(double)in_stack_ffffffffffffffc0);
  *(double *)(in_RDI + 0x10) = dVar5;
  for (iVar1 = 0; iVar1 < *(int *)(*(long *)(in_RDI + 6) + 8); iVar1 = iVar1 + 1) {
    __x = (value_type *)(in_RDI + 0x16);
    this_01 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffffc0);
    std::vector<Event_*,_std::allocator<Event_*>_>::push_back
              ((vector<Event_*,_std::allocator<Event_*>_> *)this_01,__x);
    in_stack_ffffffffffffffc0 = this_01;
  }
  return;
}

Assistant:

void ReceptiveFieldEncodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != 1) {
        cout << "There can only be one input neuron" << endl;
        throw "There can only be one input neuron";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    spikeTimes = Eigen::VectorXd(param->number_of_neurons);
    spikeTimes.setConstant(-1);
    currentWindow = param->window_length_s;
    gaussianMax = gaussian(0, param->input_min);
    for(int i = 0; i < param->number_of_neurons; i++) {
        output.push_back(new NoEvent());
    }
}